

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

example * VW::read_example(vw *all,char *example_line)

{
  uint64_t *puVar1;
  example *ex;
  
  ex = get_unused_example(all);
  read_line(all,ex,example_line);
  setup_example(all,ex);
  puVar1 = &all->p->end_parsed_examples;
  *puVar1 = *puVar1 + 1;
  return ex;
}

Assistant:

example* read_example(vw& all, char* example_line)
{
  example* ret = &get_unused_example(&all);

  VW::read_line(all, ret, example_line);
  setup_example(all, ret);
  all.p->end_parsed_examples++;

  return ret;
}